

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

string __thiscall mjs::global_object_impl::common_string(global_object_impl *this,char *str)

{
  slot *psVar1;
  uint64_t uVar2;
  gc_heap **ppgVar3;
  byte bVar4;
  gc_table *pgVar5;
  gc_string *pgVar6;
  void *pvVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *in_RDX;
  gc_heap *extraout_RDX;
  gc_heap *pgVar10;
  gc_heap *extraout_RDX_00;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint32_t uVar14;
  ulong uVar15;
  uint uVar16;
  string sVar17;
  undefined1 local_68 [16];
  slot *local_58;
  ulong local_50;
  gc_table *local_48;
  gc_table *local_40;
  byte *local_38;
  
  psVar1 = *(slot **)(str + 8);
  uVar16 = *(uint *)(str + 0x70);
  uVar15 = (ulong)uVar16;
  bVar4 = *in_RDX;
  if (bVar4 == 0) {
    uVar11 = 0x811c9dc5;
  }
  else {
    pbVar8 = in_RDX + 1;
    uVar11 = 0x811c9dc5;
    do {
      uVar11 = (uint)bVar4 ^ uVar11 * 0x1000193;
      bVar4 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar4 != 0);
  }
  uVar12 = uVar16 - 1;
  if ((*(uint32_t *)((long)psVar1 + 0x1c) <= uVar12) && (uVar12 < psVar1[4].new_position)) {
    uVar2 = psVar1[2].representation;
    if (gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>>::
        reg._40_4_ != *(int *)(uVar2 + 4 + (ulong)uVar12 * 8)) {
      __assert_fail("h.type_check<T>(pos_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x1db,
                    "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>, strong = true]"
                   );
    }
    local_58 = psVar1;
    if ((*(uint32_t *)((long)psVar1 + 0x1c) <= uVar16) && (uVar16 < psVar1[4].new_position)) {
      local_48 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                             (uVar2 + uVar15 * 8));
      local_40 = local_48 + 1;
      pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                           (uVar2 + uVar15 * 8));
      uVar14 = pgVar5->length_;
      if (uVar14 != 0) {
        local_38 = in_RDX + 1;
        uVar16 = 0;
        local_50 = uVar15;
        do {
          pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                             (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                               (uVar2 + uVar15 * 8));
          if (pgVar5->length_ <= uVar16) {
            __assert_fail("index < tab().length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                          ,0x19,
                          "T &mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::operator[](uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                         );
          }
          pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                             (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                               (uVar2 + uVar15 * 8));
          uVar9 = (ulong)uVar16;
          if (*(int *)((long)&pgVar5[1].heap_ + uVar9 * 8 + 4) == 0) {
            pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                               (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                                 (uVar2 + uVar15 * 8));
            if (pgVar5->capacity_ <= uVar16) {
              __assert_fail("index < capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                            ,0x87,
                            "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::erase(uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                           );
            }
            memmove(&pgVar5[1].heap_ + uVar9,&pgVar5[1].capacity_ + uVar9 * 2,
                    (ulong)(~uVar16 + pgVar5->length_) << 3);
            pgVar5->length_ = pgVar5->length_ - 1;
            uVar16 = uVar16 - 1;
            uVar14 = uVar14 - 1;
            uVar15 = local_50;
          }
          else if (*(uint *)(&local_40->heap_ + uVar9) == uVar11) {
            ppgVar3 = &local_40->heap_;
            pgVar6 = gc_heap_ptr_untracked<mjs::gc_string,_false>::dereference
                               ((gc_heap_ptr_untracked<mjs::gc_string,_false> *)
                                ((long)(ppgVar3 + uVar9) + 4),(gc_heap *)&local_58->allocation);
            uVar12 = pgVar6->length_;
            pbVar8 = in_RDX;
            uVar15 = local_50;
            if ((ulong)uVar12 != 0) {
              pbVar8 = local_38 + (uVar12 - 1);
              uVar13 = 0;
              do {
                if (pgVar6[uVar13 + 1].length_ != (int)(char)in_RDX[uVar13]) goto LAB_0013ecc0;
                uVar13 = uVar13 + 1;
              } while (uVar12 != uVar13);
            }
            if (*pbVar8 == 0) {
              if (uVar16 != 0) {
                pgVar10 = ppgVar3[uVar9];
                do {
                  (&local_48[1].heap_)[uVar9] = *(gc_heap **)(&local_48->capacity_ + uVar9 * 2);
                  *(gc_heap **)(&local_48->capacity_ + uVar9 * 2) = pgVar10;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
              gc_heap::unsafe_create_from_position<mjs::gc_string>
                        ((gc_heap *)local_68,(uint32_t)local_58);
              (this->super_global_object).super_object._vptr_object = (_func_int **)local_68._0_8_;
              *(undefined4 *)&(this->super_global_object).super_object.heap_ = local_68._8_4_;
              if ((gc_heap *)local_68._0_8_ != (gc_heap *)0x0) {
                gc_heap::attach((gc_heap *)local_68._0_8_,(gc_heap_ptr_untyped *)this);
              }
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
              pgVar10 = extraout_RDX_00;
              goto LAB_0013ee2a;
            }
          }
LAB_0013ecc0:
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar14);
      }
      local_68._0_8_ = strlen((char *)in_RDX);
      local_68._8_8_ = in_RDX;
      string::string((string *)this,(gc_heap *)&local_58->allocation,(string_view *)local_68);
      pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                           (uVar2 + uVar15 * 8));
      uVar16 = pgVar5->length_;
      pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                           (uVar2 + uVar15 * 8));
      if (uVar16 < pgVar5->capacity_) {
        pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                             (uVar2 + uVar15 * 8));
        uVar14 = pgVar5->length_;
        if (uVar14 == pgVar5->capacity_) {
          if ((int)uVar14 < 0) {
            __assert_fail("new_capacity >= length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                          ,0x6a,
                          "gc_heap_ptr<gc_table> mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::copy_with_increased_capacity(uint32_t) const [T = mjs::(anonymous namespace)::string_cache::entry]"
                         );
          }
          gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table::make<>
                    ((gc_table *)local_68,pgVar5->heap_,uVar14 * 2);
          pvVar7 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_68);
          if (*(uint *)((long)pvVar7 + 8) < pgVar5->length_) {
            __assert_fail("new_length <= capacity_",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                          ,0x73,
                          "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::length(uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                         );
          }
          *(uint32_t *)((long)pvVar7 + 0xc) = pgVar5->length_;
          pvVar7 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_68);
          memcpy((void *)((long)pvVar7 + 0x10),pgVar5 + 1,(ulong)pgVar5->length_ << 3);
          *(undefined4 *)(uVar2 + 8 + uVar15 * 8) = local_68._8_4_;
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
        }
        pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                             (uVar2 + uVar15 * 8));
        uVar16 = pgVar5->length_;
        if (pgVar5->capacity_ <= uVar16) {
          __assert_fail("length() < capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                        ,0x7c,
                        "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::push_back(const T &) [T = mjs::(anonymous namespace)::string_cache::entry]"
                       );
        }
        pgVar5->length_ = uVar16 + 1;
        (&pgVar5[1].heap_)[uVar16] = (gc_heap *)0x0;
        pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                             (uVar2 + uVar15 * 8));
        if (local_48 != pgVar5) {
          __assert_fail("es_data == es.data()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                        ,0x1ec,
                        "string mjs::(anonymous namespace)::string_cache::get(gc_heap &, const char *)"
                       );
        }
      }
      pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         (*(gc_vector<mjs::(anonymous_namespace)::string_cache::entry> **)
                           (uVar2 + uVar15 * 8));
      uVar16 = pgVar5->length_ - 1;
      pgVar10 = extraout_RDX;
      if (uVar16 != 0) {
        uVar15 = (ulong)uVar16;
        do {
          uVar9 = uVar15 - 1;
          pgVar10 = (&local_40->heap_)[uVar9 & 0xffffffff];
          (&local_40->heap_)[uVar15] = pgVar10;
          uVar15 = uVar9;
        } while ((int)uVar9 != 0);
      }
      local_40->heap_ =
           (gc_heap *)
           CONCAT44(*(undefined4 *)&(this->super_global_object).super_object.heap_,uVar11);
LAB_0013ee2a:
      sVar17.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = pgVar10;
      sVar17.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
      return (string)sVar17.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
    }
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

string common_string(const char* str) override {
        return string_cache_.get(heap(), str);
    }